

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.h
# Opt level: O0

void __thiscall
dlib::font::
draw_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>,dlib::rgb_pixel>
          (font *this,canvas *c,rectangle *rect,
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          *str,rgb_pixel *color,size_type first,size_type last,rectangle area_)

{
  char cVar1;
  bool bVar2;
  unsigned_short uVar3;
  size_type sVar4;
  long lVar5;
  long lVar6;
  const_reference pvVar7;
  long *plVar8;
  letter *plVar9;
  point *ppVar10;
  rgb_pixel *src;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RCX;
  rectangle *in_RDX;
  canvas *in_RSI;
  long *in_RDI;
  ulong in_R9;
  ulong in_stack_00000008;
  long y;
  long x;
  unsigned_short i_1;
  letter *l;
  size_type i;
  long pos;
  long y_offset;
  font *f;
  rectangle area;
  rgb_pixel *in_stack_fffffffffffffe98;
  canvas *in_stack_fffffffffffffea0;
  rectangle *in_stack_fffffffffffffec8;
  rectangle *in_stack_fffffffffffffed0;
  unsigned_short local_9a;
  ulong local_90;
  long local_88;
  long local_80;
  rectangle local_50;
  ulong local_30;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_20;
  rectangle *local_18;
  canvas *local_10;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  rectangle::intersect(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  rectangle::intersect(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  bVar2 = rectangle::is_empty(&local_50);
  if ((!bVar2) &&
     (sVar4 = std::__cxx11::
              basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
              ::size(local_20), sVar4 != 0)) {
    if (in_stack_00000008 == 0xffffffffffffffff) {
      sVar4 = std::__cxx11::
              basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
              ::size(local_20);
      in_stack_00000008 = sVar4 - 1;
    }
    lVar5 = rectangle::top(local_18);
    lVar6 = (**(code **)(*in_RDI + 0x28))();
    local_80 = lVar5 + lVar6 + -1;
    local_88 = rectangle::left(local_18);
    lVar5 = (**(code **)(*in_RDI + 0x30))();
    local_88 = local_88 + lVar5;
    for (local_90 = local_30; local_90 <= in_stack_00000008; local_90 = local_90 + 1) {
      pvVar7 = std::__cxx11::
               basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
               ::operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
      if (*pvVar7 != 0xd) {
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
        bVar2 = is_combining_char<unsigned_int>((uint)in_stack_fffffffffffffea0);
        if (bVar2) {
          lVar5 = rectangle::left(local_18);
          lVar6 = (**(code **)(*in_RDI + 0x30))();
          if (lVar5 + lVar6 < local_88) {
            pvVar7 = std::__cxx11::
                     basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98)
            ;
            plVar9 = (letter *)(**(code **)(*in_RDI + 0x18))(in_RDI,*pvVar7);
            uVar3 = letter::width(plVar9);
            local_88 = local_88 - (ulong)uVar3;
          }
        }
        pvVar7 = std::__cxx11::
                 basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
        if (*pvVar7 == 10) {
          lVar5 = (**(code **)(*in_RDI + 0x20))();
          local_80 = lVar5 + local_80;
          local_88 = rectangle::left(local_18);
          lVar5 = (**(code **)(*in_RDI + 0x30))();
          local_88 = local_88 + lVar5;
        }
        else {
          plVar8 = rectangle::bottom(&local_50);
          lVar5 = *plVar8;
          lVar6 = (**(code **)(*in_RDI + 0x20))();
          if (lVar5 + lVar6 < local_80) {
            return;
          }
          plVar8 = rectangle::left(&local_50);
          lVar5 = *plVar8;
          lVar6 = (**(code **)(*in_RDI + 0x30))();
          if (local_88 - lVar6 < lVar5) {
            pvVar7 = std::__cxx11::
                     basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98)
            ;
            plVar9 = (letter *)(**(code **)(*in_RDI + 0x18))(in_RDI,*pvVar7);
            uVar3 = letter::width(plVar9);
            lVar5 = (**(code **)(*in_RDI + 0x38))();
            plVar8 = rectangle::left(&local_50);
            if ((long)(local_88 + (ulong)uVar3 + lVar5) < *plVar8) {
              plVar8 = in_RDI;
              pvVar7 = std::__cxx11::
                       basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)in_stack_fffffffffffffea0,
                                    (size_type)in_stack_fffffffffffffe98);
              plVar9 = (letter *)(**(code **)(*plVar8 + 0x18))(plVar8,*pvVar7);
              uVar3 = letter::width(plVar9);
              local_88 = (ulong)uVar3 + local_88;
              goto LAB_00454442;
            }
          }
          plVar8 = rectangle::right(&local_50);
          lVar5 = *plVar8;
          lVar6 = (**(code **)(*in_RDI + 0x38))();
          if (local_88 <= lVar5 + lVar6) {
            pvVar7 = std::__cxx11::
                     basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::operator[]((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98)
            ;
            plVar9 = (letter *)(**(code **)(*in_RDI + 0x18))(in_RDI,*pvVar7);
            for (local_9a = 0; uVar3 = letter::num_of_points(plVar9), local_9a < uVar3;
                local_9a = local_9a + 1) {
              ppVar10 = letter::operator[](plVar9,local_9a);
              cVar1 = ppVar10->x;
              ppVar10 = letter::operator[](plVar9,local_9a);
              src = (rgb_pixel *)(ppVar10->y + local_80);
              bVar2 = rectangle::contains(&local_50,cVar1 + local_88,(long)src);
              if (bVar2) {
                in_stack_fffffffffffffea0 = local_10;
                lVar5 = rectangle::top(&local_10->super_rectangle);
                canvas::operator[](in_stack_fffffffffffffea0,(long)src - lVar5);
                rectangle::left(&local_10->super_rectangle);
                assign_pixel<dlib::canvas::pixel,dlib::rgb_pixel>
                          ((pixel *)in_stack_fffffffffffffea0,src);
                in_stack_fffffffffffffe98 = src;
              }
            }
            uVar3 = letter::width(plVar9);
            local_88 = (ulong)uVar3 + local_88;
          }
        }
      }
LAB_00454442:
    }
  }
  return;
}

Assistant:

void draw_string (
            const canvas& c,
            const rectangle& rect,
            const std::basic_string<T,traits,alloc>& str,
            const pixel_type& color,
            typename std::basic_string<T,traits,alloc>::size_type first = 0,
            typename std::basic_string<T,traits,alloc>::size_type last = (std::basic_string<T,traits,alloc>::npos),
            const rectangle area_ = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                            std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
        ) const
        {
            typedef std::basic_string<T,traits,alloc> string;
            DLIB_ASSERT ( (last == string::npos) || (first <= last && last < str.size())  ,
                          "\tvoid font::draw_string()"
                          << "\n\tlast == string::npos: " << ((last == string::npos)?"true":"false") 
                          << "\n\tfirst: " << (unsigned long)first 
                          << "\n\tlast:  " << (unsigned long)last 
                          << "\n\tstr.size():  " << (unsigned long)str.size() );

            rectangle area = rect.intersect(c).intersect(area_);
            if (area.is_empty() || str.size() == 0)
                return;

            if (last == string::npos)
                last = str.size()-1;

            const font& f = *this;        

            long y_offset = rect.top() + f.ascender() - 1;

            long pos = rect.left()+f.left_overflow();
            for (typename string::size_type i = first; i <= last; ++i)
            {
                // ignore the '\r' character
                if (str[i] == '\r')
                    continue;

                // A combining character should be applied to the previous character, and we
                // therefore make one step back. If a combining comes right after a newline, 
                // then there must be some kind of error in the string, and we don't combine.
                if(is_combining_char(str[i]) && 
                   pos > rect.left() + static_cast<long>(f.left_overflow()))
                {
                    pos -= f[str[i]].width();
                }

                if (str[i] == '\n')
                {
                    y_offset += f.height();
                    pos = rect.left()+f.left_overflow();
                    continue;
                }

                // only look at letters in the intersection area
                if (area.bottom() + static_cast<long>(f.height()) < y_offset)
                {
                    // the string is now below our rectangle so we are done
                    break;
                }
                else if (area.left() > pos - static_cast<long>(f.left_overflow()) && 
                    pos + static_cast<long>(f[str[i]].width() + f.right_overflow()) < area.left() )
                {
                    pos += f[str[i]].width();                
                    continue;
                }
                else if (area.right() + static_cast<long>(f.right_overflow()) < pos)
                {
                    // keep looking because there might be a '\n' in the string that
                    // will wrap us around and put us back into our rectangle.
                    continue;
                }

                // at this point in the loop we know that f[str[i]] overlaps 
                // horizontally with the intersection rectangle area.

                const letter& l = f[str[i]];
                for (unsigned short i = 0; i < l.num_of_points(); ++i)
                {
                    const long x = l[i].x + pos;
                    const long y = l[i].y + y_offset;
                    // draw each pixel of the letter if it is inside the intersection
                    // rectangle
                    if (area.contains(x,y))
                    {
                        assign_pixel(c[y-c.top()][x-c.left()], color);
                    }
                }

                pos += l.width();
            }
        }